

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O3

void ddReportRefMess(DdManager *unique,int i,char *caller)

{
  if (i != -1) {
    if (i == 0x7fffffff) {
      fprintf((FILE *)unique->err,"%s: problem in constants\n","cuddGarbageCollect",(ulong)(uint)i);
    }
    else {
      fprintf((FILE *)unique->err,"%s: problem in table %d\n","cuddGarbageCollect",(ulong)(uint)i);
    }
  }
  fwrite("  dead count != deleted\n",0x18,1,(FILE *)unique->err);
  fwrite("  This problem is often due to a missing call to Cudd_Ref\n  or to an extra call to Cudd_RecursiveDeref.\n  See the CUDD Programmer\'s Guide for additional details."
         ,0xa1,1,(FILE *)unique->err);
  abort();
}

Assistant:

static void
ddReportRefMess(
  DdManager *unique /* manager */,
  int i /* table in which the problem occurred */,
  const char *caller /* procedure that detected the problem */)
{
    if (i == CUDD_CONST_INDEX) {
        (void) fprintf(unique->err,
                           "%s: problem in constants\n", caller);
    } else if (i != -1) {
        (void) fprintf(unique->err,
                           "%s: problem in table %d\n", caller, i);
    }
    (void) fprintf(unique->err, "  dead count != deleted\n");
    (void) fprintf(unique->err, "  This problem is often due to a missing \
call to Cudd_Ref\n  or to an extra call to Cudd_RecursiveDeref.\n  \
See the CUDD Programmer's Guide for additional details.");
    abort();

}